

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

bool __thiscall
Clasp::Asp::PrgAtom::addConstraints(PrgAtom *this,LogicProgram *prg,ClauseCreator *gc)

{
  bool bVar1;
  Literal x;
  Literal y;
  SharedContext *this_00;
  iterator pPVar2;
  PrgNode *this_01;
  ProgramBuilder *in_RSI;
  PrgNode *in_RDI;
  Literal B;
  PrgNode *n;
  iterator it;
  bool nant;
  iterator j;
  SharedContext *ctx;
  undefined4 in_stack_ffffffffffffff38;
  undefined1 b;
  ConstraintType in_stack_ffffffffffffff3c;
  ClauseCreator *in_stack_ffffffffffffff40;
  LogicProgram *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  SharedContext *in_stack_ffffffffffffff58;
  uint32 flags;
  undefined6 in_stack_ffffffffffffff60;
  byte in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  PrgEdge *local_48;
  bool local_31;
  iterator local_30;
  
  this_00 = ProgramBuilder::ctx(in_RSI);
  local_30 = bk_lib::pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::begin
                       ((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)
                        (in_RDI + 1));
  local_31 = false;
  ClauseCreator::start(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  PrgNode::literal((PrgNode *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  Literal::operator~((Literal *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  ClauseCreator::add(in_stack_ffffffffffffff40,
                     (Literal *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  for (local_48 = bk_lib::pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::
                  begin((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)
                        (in_RDI + 1));
      pPVar2 = bk_lib::pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::end
                         ((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)
                          (in_RDI + 1)), local_48 != pPVar2; local_48 = local_48 + 1) {
    this_01 = LogicProgram::getSupp
                        (in_stack_ffffffffffffff48,
                         (PrgEdge)(uint32)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    PrgNode::literal((PrgNode *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    bVar1 = PrgNode::relevant(this_01);
    if ((bVar1) && (bVar1 = PrgNode::hasVar(this_01), bVar1)) {
      local_30->rep = local_48->rep;
      bVar1 = local_31 == false;
      local_31 = true;
      if (bVar1) {
        local_31 = PrgEdge::isChoice(local_48);
      }
      in_stack_ffffffffffffff67 = local_31;
      bVar1 = PrgEdge::isDisj((PrgEdge *)0x1a1982);
      if (!bVar1) {
        ClauseCreator::add(in_stack_ffffffffffffff40,
                           (Literal *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
        ;
      }
      bVar1 = PrgEdge::isNormal(local_48);
      in_stack_ffffffffffffff66 = 0;
      if (bVar1) {
        in_stack_ffffffffffffff58 = this_00;
        x = PrgNode::literal((PrgNode *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        y = Literal::operator~((Literal *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        bVar1 = SharedContext::addBinary
                          ((SharedContext *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),x,y);
        in_stack_ffffffffffffff66 = bVar1 ^ 0xff;
      }
      local_30 = local_30 + 1;
      if ((in_stack_ffffffffffffff66 & 1) != 0) {
        return false;
      }
    }
  }
  bk_lib::pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::end
            ((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)(in_RDI + 1));
  b = (undefined1)((uint)in_stack_ffffffffffffff38 >> 0x18);
  bk_lib::pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::erase
            ((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)
             CONCAT17(in_stack_ffffffffffffff67,
                      CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),
             (iterator)in_stack_ffffffffffffff58,local_30);
  if (local_31 == false) {
    bVar1 = hasDep((PrgAtom *)in_stack_ffffffffffffff58,(Dependency)((ulong)local_30 >> 0x20));
    flags = (uint32)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    if (!bVar1) goto LAB_001a1aa9;
  }
  flags = (uint32)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  PrgNode::var(in_RDI);
  SharedContext::setNant(this_00,in_stack_ffffffffffffff3c,(bool)b);
LAB_001a1aa9:
  ClauseCreator::end((ClauseCreator *)
                     CONCAT17(in_stack_ffffffffffffff67,
                              CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),flags);
  bVar1 = ClauseCreator::Result::operator_cast_to_bool((Result *)0x1a1ae0);
  return bVar1;
}

Assistant:

bool PrgAtom::addConstraints(const LogicProgram& prg, ClauseCreator& gc) {
	SharedContext& ctx  = *prg.ctx();
	EdgeVec::iterator j = supports_.begin();
	bool           nant = false;
	gc.start().add(~literal());
	for (EdgeVec::iterator it = supports_.begin(); it != supports_.end(); ++it) {
		PrgNode* n = prg.getSupp(*it);
		Literal  B = n->literal();
		// consider only bodies which are part of the simplified program, i.e.
		// are associated with a variable in the solver.
		if (n->relevant() && n->hasVar()) {
			*j++ = *it;
			nant = nant || it->isChoice();
			if (!it->isDisj()) { gc.add(B); }
			if (it->isNormal() && !ctx.addBinary(literal(), ~B)) { // FTA/BFA
				return false;
			}
		}
	}
	supports_.erase(j, supports_.end());
	if (nant ||	hasDep(PrgAtom::dep_neg)) { ctx.setNant(var(), true); }
	return gc.end(ClauseCreator::clause_force_simplify);
}